

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::AnyEq::operator()
          (AnyEq *this,basic_string_view<char,_std::char_traits<char>_> *a,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  string *in_RDX;
  char *in_RSI;
  size_t in_RDI;
  char *unaff_retaddr;
  
  std::__cxx11::string::operator_cast_to_basic_string_view(in_RDX);
  __x._M_str = unaff_retaddr;
  __x._M_len = in_RDI;
  __y._M_str = in_RSI;
  __y._M_len = (size_t)in_RDX;
  bVar1 = std::operator==(__x,__y);
  return bVar1;
}

Assistant:

bool operator()(const A& a, const B& b) const { return a == b; }